

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ImportModuleTypedefs(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  ByteCode *code;
  char *pcVar1;
  InplaceStr name;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ExternTypedefInfo *pEVar6;
  SynIdentifier *this;
  TypeBase *type_00;
  TypeBase *pTVar7;
  AliasData *this_00;
  AliasData *alias_1;
  TypeBase *type;
  TypeBase *targetType;
  SynIdentifier *aliasNameIdentifier;
  InplaceStr aliasName;
  ExternTypedefInfo *alias;
  uint i;
  ExternTypedefInfo *aliasList;
  char *symbols;
  ByteCode *bCode;
  TraceScope traceScope;
  ModuleContext *moduleCtx_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if ((ImportModuleTypedefs(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ImportModuleTypedefs(ExpressionContext&,SynBase*,ModuleContext&)
                                   ::token), iVar3 != 0)) {
    ImportModuleTypedefs::token = NULLC::TraceGetToken("analyze","ImportModuleTypedefs");
    __cxa_guard_release(&ImportModuleTypedefs(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&bCode,ImportModuleTypedefs::token);
  code = moduleCtx->data->bytecode;
  pcVar5 = FindSymbols(code);
  pEVar6 = FindFirstTypedef(code);
  for (alias._4_4_ = 0; alias._4_4_ < code->typedefCount; alias._4_4_ = alias._4_4_ + 1) {
    aliasName.end = (char *)(pEVar6 + alias._4_4_);
    InplaceStr::InplaceStr
              ((InplaceStr *)&aliasNameIdentifier,
               pcVar5 + ((ExternTypedefInfo *)aliasName.end)->offsetToName);
    this = ExpressionContext::get<SynIdentifier>(ctx);
    name.end = aliasName.begin;
    name.begin = (char *)aliasNameIdentifier;
    SynIdentifier::SynIdentifier(this,name);
    type_00 = GetImportedModuleTypeAt(ctx,source,moduleCtx,*(uint *)(aliasName.end + 4));
    if (type_00 == (TypeBase *)0x0) {
      anon_unknown.dwarf_8df1c::Stop
                (ctx,source,"ERROR: can\'t find alias \'%s\' target type in module %.*s",
                 pcVar5 + *(uint *)aliasName.end,
                 (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                              (int)(moduleCtx->data->name).begin));
    }
    uVar4 = InplaceStr::hash((InplaceStr *)&aliasNameIdentifier);
    pTVar7 = anon_unknown.dwarf_8df1c::LookupTypeByName(ctx,uVar4);
    if (pTVar7 == (TypeBase *)0x0) {
      if (*(int *)(aliasName.end + 8) == -1) {
        this_00 = ExpressionContext::get<AliasData>(ctx);
        uVar4 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar4 + 1;
        AliasData::AliasData(this_00,source,ctx->scope,type_00,this,uVar4);
        this_00->importModule = moduleCtx->data;
        ExpressionContext::AddAlias(ctx,this_00);
      }
    }
    else {
      bVar2 = InplaceStr::operator==(&pTVar7->name,(InplaceStr *)&aliasNameIdentifier);
      if (bVar2) {
        pcVar1 = (type_00->name).begin;
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,source,
                   "ERROR: type \'%.*s\' alias \'%s\' is equal to previously imported class",
                   (ulong)(uint)(*(int *)&(type_00->name).end - (int)pcVar1),pcVar1,
                   pcVar5 + *(uint *)aliasName.end);
      }
      if (pTVar7 != type_00) {
        pcVar1 = (type_00->name).begin;
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,source,
                   "ERROR: type \'%.*s\' alias \'%s\' is equal to previously imported alias",
                   (ulong)(uint)(*(int *)&(type_00->name).end - (int)pcVar1),pcVar1,
                   pcVar5 + *(uint *)aliasName.end);
      }
    }
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&bCode);
  return;
}

Assistant:

void ImportModuleTypedefs(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleTypedefs");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import type aliases
	ExternTypedefInfo *aliasList = FindFirstTypedef(bCode);

	for(unsigned i = 0; i < bCode->typedefCount; i++)
	{
		ExternTypedefInfo &alias = aliasList[i];

		InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

		SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

		TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

		if(!targetType)
			Stop(ctx, source, "ERROR: can't find alias '%s' target type in module %.*s", symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

		if(TypeBase *type = LookupTypeByName(ctx, aliasName.hash()))
		{
			if(type->name == aliasName)
				Stop(ctx, source, "ERROR: type '%.*s' alias '%s' is equal to previously imported class", FMT_ISTR(targetType->name), symbols + alias.offsetToName);

			if(type != targetType)
				Stop(ctx, source, "ERROR: type '%.*s' alias '%s' is equal to previously imported alias", FMT_ISTR(targetType->name), symbols + alias.offsetToName);
		}
		else if(alias.parentType != ~0u)
		{
			// Type alises were imported during type import
		}
		else
		{
			AliasData *alias = new (ctx.get<AliasData>()) AliasData(source, ctx.scope, targetType, aliasNameIdentifier, ctx.uniqueAliasId++);

			alias->importModule = moduleCtx.data;

			ctx.AddAlias(alias);
		}
	}
}